

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::InlineOpaquePass::ProcessImpl(InlineOpaquePass *this)

{
  Status SVar1;
  IRContext *this_00;
  anon_class_16_2_a97f2545 local_48;
  undefined1 local_38 [8];
  ProcessFunction pfn;
  Status status;
  InlineOpaquePass *this_local;
  
  pfn._M_invoker._4_4_ = SuccessWithoutChange;
  local_48.status = (Status *)((long)&pfn._M_invoker + 4);
  local_48.this = this;
  std::function<bool(spvtools::opt::Function*)>::
  function<spvtools::opt::InlineOpaquePass::ProcessImpl()::__0,void>
            ((function<bool(spvtools::opt::Function*)> *)local_38,&local_48);
  this_00 = Pass::context((Pass *)this);
  IRContext::ProcessReachableCallTree(this_00,(ProcessFunction *)local_38);
  SVar1 = pfn._M_invoker._4_4_;
  std::function<bool_(spvtools::opt::Function_*)>::~function
            ((function<bool_(spvtools::opt::Function_*)> *)local_38);
  return SVar1;
}

Assistant:

Pass::Status InlineOpaquePass::ProcessImpl() {
  Status status = Status::SuccessWithoutChange;
  // Do opaque inlining on each function in entry point call tree
  ProcessFunction pfn = [&status, this](Function* fp) {
    status = CombineStatus(status, InlineOpaque(fp));
    return false;
  };
  context()->ProcessReachableCallTree(pfn);
  return status;
}